

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O3

void * rw::destroyHAnim(void *object,int32 offset,int32 param_3)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  long lVar9;
  
  auVar4 = _DAT_001348e0;
  lVar6 = (long)offset;
  lVar2 = *(long *)((long)object + lVar6 + 8);
  if (lVar2 != 0) {
    iVar1 = *(int *)(lVar2 + 4);
    if (0 < (long)iVar1) {
      lVar3 = *(long *)(lVar2 + 0x18);
      lVar5 = (long)iVar1 + -1;
      auVar7._8_4_ = (int)lVar5;
      auVar7._0_8_ = lVar5;
      auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
      lVar5 = 0;
      auVar7 = auVar7 ^ _DAT_001348e0;
      auVar8 = _DAT_00134e90;
      do {
        auVar10 = auVar8 ^ auVar4;
        if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                    auVar7._4_4_ < auVar10._4_4_) & 1)) {
          *(undefined8 *)(lVar3 + 0x10 + lVar5) = 0;
        }
        if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
            auVar10._12_4_ <= auVar7._12_4_) {
          *(undefined8 *)(lVar3 + 0x28 + lVar5) = 0;
        }
        lVar9 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar9 + 2;
        lVar5 = lVar5 + 0x30;
      } while ((ulong)(iVar1 + 1U >> 1) * 0x30 != lVar5);
    }
    if (*(void **)(lVar2 + 0x20) == object) {
      AnimInterpolator::destroy(*(AnimInterpolator **)(lVar2 + 0x30));
      (*DAT_0014ada0)(*(undefined8 *)(lVar2 + 0x10));
      (*DAT_0014ada0)(*(undefined8 *)(lVar2 + 0x18));
      (*DAT_0014ada0)(lVar2);
    }
  }
  *(undefined4 *)((long)object + lVar6) = 0xffffffff;
  *(undefined8 *)((long)object + lVar6 + 8) = 0;
  return object;
}

Assistant:

static void*
destroyHAnim(void *object, int32 offset, int32)
{
	int i;
	HAnimData *hanim = PLUGINOFFSET(HAnimData, object, offset);
	if(hanim->hierarchy){
		for(i = 0; i < hanim->hierarchy->numNodes; i++)
			hanim->hierarchy->nodeInfo[i].frame = nil;
		if(object == hanim->hierarchy->parentFrame)
			hanim->hierarchy->destroy();
	}
	hanim->id = -1;
	hanim->hierarchy = nil;
	return object;
}